

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataExtractor.cpp
# Opt level: O1

uint32_t * __thiscall
llvm::DataExtractor::getU32(DataExtractor *this,uint64_t *offset_ptr,uint32_t *dst,uint32_t count)

{
  uint8_t uVar1;
  char *Data;
  uint uVar2;
  uint32_t *puVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  
  uVar4 = *offset_ptr;
  uVar5 = (ulong)count;
  puVar3 = (uint32_t *)0x0;
  if ((uVar4 <= uVar4 + uVar5 * 4) && ((uVar4 + uVar5 * 4) - 1 < (this->Data).Length)) {
    if (count != 0) {
      uVar1 = this->IsLittleEndian;
      Data = (this->Data).Data;
      lVar6 = 0;
      do {
        uVar2 = getU<unsigned_int>(offset_ptr,this,uVar1 != '\0',Data,(Error *)0x0);
        *(uint *)((long)dst + lVar6) = uVar2;
        lVar6 = lVar6 + 4;
      } while (uVar5 << 2 != lVar6);
      uVar4 = uVar4 + lVar6;
    }
    *offset_ptr = uVar4;
    puVar3 = dst;
  }
  return puVar3;
}

Assistant:

uint32_t *DataExtractor::getU32(uint64_t *offset_ptr, uint32_t *dst,
                                uint32_t count) const {
  return getUs<uint32_t>(offset_ptr, dst, count, this, IsLittleEndian,
                         Data.data(), nullptr);
}